

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O2

String * kj::_::operator*(String *__return_storage_ptr__,long param_2,undefined8 param_3,
                         undefined8 param_4,StringPtr *param_5)

{
  Array<char> local_40;
  StringPtr local_28;
  
  operator*<kj::Url>(&local_40);
  local_28.content.ptr = "(can\'t stringify)";
  local_28.content.size_ = 0x12;
  concat<kj::String,kj::StringPtr&,kj::StringPtr>
            (__return_storage_ptr__,(_ *)&local_40,(String *)(param_2 + 0xf0),&local_28,param_5);
  Array<char>::~Array(&local_40);
  return __return_storage_ptr__;
}

Assistant:

String KJ_STRINGIFY(DebugComparison<Left, Right>& cmp) {
  return _::concat(tryToCharSequence(&cmp.left), cmp.op, tryToCharSequence(&cmp.right));
}